

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

Aig_Obj_t * Dar_BalanceBuildSuper(Aig_Man_t *p,Vec_Ptr_t *vSuper,Aig_Type_t Type,int fUpdateLevel)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darBalance.c"
                  ,0x193,
                  "Aig_Obj_t *Dar_BalanceBuildSuper(Aig_Man_t *, Vec_Ptr_t *, Aig_Type_t, int)");
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Aig_NodeCompareLevelsDecrease);
  iVar1 = vSuper->nSize;
  if (1 < iVar1) {
    do {
      if (fUpdateLevel == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = Dar_BalanceFindLeft(vSuper);
      }
      Dar_BalancePermute(p,vSuper,iVar1,(uint)(Type == AIG_OBJ_EXOR));
      iVar1 = vSuper->nSize;
      if (iVar1 < 1) {
LAB_004aaab1:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      uVar3 = iVar1 - 1;
      vSuper->nSize = uVar3;
      if (uVar3 == 0) goto LAB_004aaab1;
      pAVar2 = (Aig_Obj_t *)vSuper->pArray[uVar3];
      vSuper->nSize = iVar1 - 2U;
      pAVar2 = Aig_Oper(p,pAVar2,(Aig_Obj_t *)vSuper->pArray[iVar1 - 2U],Type);
      Dar_BalancePushUniqueOrderByLevel(vSuper,pAVar2,(uint)(Type == AIG_OBJ_EXOR));
      iVar1 = vSuper->nSize;
    } while (1 < iVar1);
  }
  if (iVar1 == 1) {
    return (Aig_Obj_t *)*vSuper->pArray;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t * Dar_BalanceBuildSuper( Aig_Man_t * p, Vec_Ptr_t * vSuper, Aig_Type_t Type, int fUpdateLevel )
{
    Aig_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Aig_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Dar_BalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Dar_BalancePermute( p, vSuper, LeftBound, Type == AIG_OBJ_EXOR );
        // pull out the last two nodes
        pObj1 = (Aig_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Aig_Obj_t *)Vec_PtrPop(vSuper);
        Dar_BalancePushUniqueOrderByLevel( vSuper, Aig_Oper(p, pObj1, pObj2, Type), Type == AIG_OBJ_EXOR );
    }
    return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
}